

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeDatePrototype
               (DynamicObject *datePrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  ScriptContext *this;
  JavascriptLibrary *this_00;
  RuntimeFunction **ppRVar2;
  JavascriptMethod p_Var3;
  JavascriptFunction *pJVar4;
  ScriptConfiguration *this_01;
  JavascriptFunction *toUTCStringFunc;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *datePrototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,datePrototype,mode,0x30,0);
  this = RecyclableObject::GetScriptContext(&datePrototype->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&datePrototype->super_RecyclableObject);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&(this_00->super_JavascriptLibraryBase).dateConstructor);
  AddMember(this_00,datePrototype,0x67,*ppRVar2);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::GetDate);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x9c,(FunctionInfo *)JavascriptDate::EntryInfo::GetDate,
                      0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::GetDay);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x9d,(FunctionInfo *)JavascriptDate::EntryInfo::GetDay,0
                      ,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetFullYear);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x9e,
                      (FunctionInfo *)JavascriptDate::EntryInfo::GetFullYear,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::GetHours);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x9f,(FunctionInfo *)JavascriptDate::EntryInfo::GetHours
                      ,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetMilliseconds);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0xa0,
                      (FunctionInfo *)JavascriptDate::EntryInfo::GetMilliseconds,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetMinutes);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0xa1,
                      (FunctionInfo *)JavascriptDate::EntryInfo::GetMinutes,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::GetMonth);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0xa2,(FunctionInfo *)JavascriptDate::EntryInfo::GetMonth
                      ,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetSeconds);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0xa8,
                      (FunctionInfo *)JavascriptDate::EntryInfo::GetSeconds,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::GetTime);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0xa9,(FunctionInfo *)JavascriptDate::EntryInfo::GetTime,
                      0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetTimezoneOffset);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0xaa,
                      (FunctionInfo *)JavascriptDate::EntryInfo::GetTimezoneOffset,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetUTCDate);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0xab,
                      (FunctionInfo *)JavascriptDate::EntryInfo::GetUTCDate,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::GetUTCDay)
  ;
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0xac,
                      (FunctionInfo *)JavascriptDate::EntryInfo::GetUTCDay,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetUTCFullYear);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0xad,
                      (FunctionInfo *)JavascriptDate::EntryInfo::GetUTCFullYear,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetUTCHours);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0xae,
                      (FunctionInfo *)JavascriptDate::EntryInfo::GetUTCHours,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetUTCMilliseconds);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0xaf,
                      (FunctionInfo *)JavascriptDate::EntryInfo::GetUTCMilliseconds,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetUTCMinutes);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0xb0,
                      (FunctionInfo *)JavascriptDate::EntryInfo::GetUTCMinutes,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetUTCMonth);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0xb1,
                      (FunctionInfo *)JavascriptDate::EntryInfo::GetUTCMonth,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetUTCSeconds);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0xb2,
                      (FunctionInfo *)JavascriptDate::EntryInfo::GetUTCSeconds,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::GetYear);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0xb3,(FunctionInfo *)JavascriptDate::EntryInfo::GetYear,
                      0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::SetDate);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x13e,(FunctionInfo *)JavascriptDate::EntryInfo::SetDate
                      ,1,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetFullYear);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x13f,
                      (FunctionInfo *)JavascriptDate::EntryInfo::SetFullYear,3,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::SetHours);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x140,
                      (FunctionInfo *)JavascriptDate::EntryInfo::SetHours,4,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetMilliseconds);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x141,
                      (FunctionInfo *)JavascriptDate::EntryInfo::SetMilliseconds,1,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetMinutes);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x142,
                      (FunctionInfo *)JavascriptDate::EntryInfo::SetMinutes,3,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::SetMonth);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x143,
                      (FunctionInfo *)JavascriptDate::EntryInfo::SetMonth,2,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetSeconds);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x144,
                      (FunctionInfo *)JavascriptDate::EntryInfo::SetSeconds,2,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::SetTime);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x145,(FunctionInfo *)JavascriptDate::EntryInfo::SetTime
                      ,1,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetUTCDate);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x146,
                      (FunctionInfo *)JavascriptDate::EntryInfo::SetUTCDate,1,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetUTCFullYear);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x147,
                      (FunctionInfo *)JavascriptDate::EntryInfo::SetUTCFullYear,3,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetUTCHours);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x148,
                      (FunctionInfo *)JavascriptDate::EntryInfo::SetUTCHours,4,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetUTCMilliseconds);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x149,
                      (FunctionInfo *)JavascriptDate::EntryInfo::SetUTCMilliseconds,1,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetUTCMinutes);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x14a,
                      (FunctionInfo *)JavascriptDate::EntryInfo::SetUTCMinutes,3,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetUTCMonth);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x14b,
                      (FunctionInfo *)JavascriptDate::EntryInfo::SetUTCMonth,2,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetUTCSeconds);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x14c,
                      (FunctionInfo *)JavascriptDate::EntryInfo::SetUTCSeconds,2,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::SetYear);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x14d,(FunctionInfo *)JavascriptDate::EntryInfo::SetYear
                      ,1,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::ToDateString);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x16b,
                      (FunctionInfo *)JavascriptDate::EntryInfo::ToDateString,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::ToISOString);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x16e,
                      (FunctionInfo *)JavascriptDate::EntryInfo::ToISOString,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::ToJSON);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x16f,(FunctionInfo *)JavascriptDate::EntryInfo::ToJSON,
                      1,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::ToLocaleDateString);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x170,
                      (FunctionInfo *)JavascriptDate::EntryInfo::ToLocaleDateString,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::ToLocaleString);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x172,
                      (FunctionInfo *)JavascriptDate::EntryInfo::ToLocaleString,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::ToLocaleTimeString);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x173,
                      (FunctionInfo *)JavascriptDate::EntryInfo::ToLocaleTimeString,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::ToString);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x178,
                      (FunctionInfo *)JavascriptDate::EntryInfo::ToString,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::ToTimeString);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x17a,
                      (FunctionInfo *)JavascriptDate::EntryInfo::ToTimeString,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x17c,
                      (FunctionInfo *)JavascriptDate::EntryInfo::ToUTCString,0,'\x06');
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::ToUTCString);
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  AddMember(this_00,datePrototype,0x19e,pJVar4,'\x06');
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::ValueOf);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,datePrototype,0x18e,(FunctionInfo *)JavascriptDate::EntryInfo::ValueOf
                      ,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
  this_01 = ScriptContext::GetConfig(this);
  bVar1 = ScriptConfiguration::IsES6ToPrimitiveEnabled(this_01);
  if (bVar1) {
    p_Var3 = FunctionInfo::GetOriginalEntryPoint
                       ((FunctionInfo *)JavascriptDate::EntryInfo::SymbolToPrimitive);
    pJVar4 = AddFunctionToLibraryObjectWithName
                       (this_00,datePrototype,0x1a,0x2c4,
                        (FunctionInfo *)JavascriptDate::EntryInfo::SymbolToPrimitive,1);
    ScriptContext::SetBuiltInLibraryFunction(this,p_Var3,pJVar4);
    (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x3b])(datePrototype,0x1a,0);
  }
  DynamicObject::SetHasNoEnumerableProperties(datePrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeDatePrototype(DynamicObject* datePrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(datePrototype, mode, 48);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterDate
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = datePrototype->GetScriptContext();
        JavascriptLibrary* library = datePrototype->GetLibrary();
        library->AddMember(datePrototype, PropertyIds::constructor, library->dateConstructor);
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetDate.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getDate, &JavascriptDate::EntryInfo::GetDate, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetDay.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getDay, &JavascriptDate::EntryInfo::GetDay, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetFullYear.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getFullYear, &JavascriptDate::EntryInfo::GetFullYear, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetHours.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getHours, &JavascriptDate::EntryInfo::GetHours, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetMilliseconds.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getMilliseconds, &JavascriptDate::EntryInfo::GetMilliseconds, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetMinutes.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getMinutes, &JavascriptDate::EntryInfo::GetMinutes, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetMonth.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getMonth, &JavascriptDate::EntryInfo::GetMonth, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetSeconds.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getSeconds, &JavascriptDate::EntryInfo::GetSeconds, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetTime.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getTime, &JavascriptDate::EntryInfo::GetTime, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetTimezoneOffset.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getTimezoneOffset, &JavascriptDate::EntryInfo::GetTimezoneOffset, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetUTCDate.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getUTCDate, &JavascriptDate::EntryInfo::GetUTCDate, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetUTCDay.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getUTCDay, &JavascriptDate::EntryInfo::GetUTCDay, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetUTCFullYear.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getUTCFullYear, &JavascriptDate::EntryInfo::GetUTCFullYear, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetUTCHours.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getUTCHours, &JavascriptDate::EntryInfo::GetUTCHours, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetUTCMilliseconds.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getUTCMilliseconds, &JavascriptDate::EntryInfo::GetUTCMilliseconds, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetUTCMinutes.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getUTCMinutes, &JavascriptDate::EntryInfo::GetUTCMinutes, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetUTCMonth.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getUTCMonth, &JavascriptDate::EntryInfo::GetUTCMonth, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetUTCSeconds.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getUTCSeconds, &JavascriptDate::EntryInfo::GetUTCSeconds, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetYear.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getYear, &JavascriptDate::EntryInfo::GetYear, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetDate.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setDate, &JavascriptDate::EntryInfo::SetDate, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetFullYear.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setFullYear, &JavascriptDate::EntryInfo::SetFullYear, 3));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetHours.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setHours, &JavascriptDate::EntryInfo::SetHours, 4));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetMilliseconds.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setMilliseconds, &JavascriptDate::EntryInfo::SetMilliseconds, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetMinutes.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setMinutes, &JavascriptDate::EntryInfo::SetMinutes, 3));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetMonth.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setMonth, &JavascriptDate::EntryInfo::SetMonth, 2));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetSeconds.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setSeconds, &JavascriptDate::EntryInfo::SetSeconds, 2));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetTime.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setTime, &JavascriptDate::EntryInfo::SetTime, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetUTCDate.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setUTCDate, &JavascriptDate::EntryInfo::SetUTCDate, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetUTCFullYear.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setUTCFullYear, &JavascriptDate::EntryInfo::SetUTCFullYear, 3));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetUTCHours.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setUTCHours, &JavascriptDate::EntryInfo::SetUTCHours, 4));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetUTCMilliseconds.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setUTCMilliseconds, &JavascriptDate::EntryInfo::SetUTCMilliseconds, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetUTCMinutes.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setUTCMinutes, &JavascriptDate::EntryInfo::SetUTCMinutes, 3));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetUTCMonth.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setUTCMonth, &JavascriptDate::EntryInfo::SetUTCMonth, 2));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetUTCSeconds.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setUTCSeconds, &JavascriptDate::EntryInfo::SetUTCSeconds, 2));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetYear.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setYear, &JavascriptDate::EntryInfo::SetYear, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ToDateString.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::toDateString, &JavascriptDate::EntryInfo::ToDateString, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ToISOString.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::toISOString, &JavascriptDate::EntryInfo::ToISOString, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ToJSON.GetOriginalEntryPoint(),
             library->AddFunctionToLibraryObject(datePrototype, PropertyIds::toJSON, &JavascriptDate::EntryInfo::ToJSON, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ToLocaleDateString.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::toLocaleDateString, &JavascriptDate::EntryInfo::ToLocaleDateString, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ToLocaleString.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::toLocaleString, &JavascriptDate::EntryInfo::ToLocaleString, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ToLocaleTimeString.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::toLocaleTimeString, &JavascriptDate::EntryInfo::ToLocaleTimeString, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ToString.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::toString, &JavascriptDate::EntryInfo::ToString, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ToTimeString.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::toTimeString, &JavascriptDate::EntryInfo::ToTimeString, 0));

        // Spec stipulates toGMTString must be the same function object as toUTCString
        JavascriptFunction *toUTCStringFunc = library->AddFunctionToLibraryObject(datePrototype, PropertyIds::toUTCString, &JavascriptDate::EntryInfo::ToUTCString, 0);
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ToUTCString.GetOriginalEntryPoint(), toUTCStringFunc);
        library->AddMember(datePrototype, PropertyIds::toGMTString, toUTCStringFunc, PropertyBuiltInMethodDefaults);

        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ValueOf.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::valueOf, &JavascriptDate::EntryInfo::ValueOf, 0));

        if (scriptContext->GetConfig()->IsES6ToPrimitiveEnabled())
        {
            scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SymbolToPrimitive.GetOriginalEntryPoint(),
                library->AddFunctionToLibraryObjectWithName(datePrototype, PropertyIds::_symbolToPrimitive, PropertyIds::_RuntimeFunctionNameId_toPrimitive,
                &JavascriptDate::EntryInfo::SymbolToPrimitive, 1));
            datePrototype->SetWritable(PropertyIds::_symbolToPrimitive, false);
        }
        datePrototype->SetHasNoEnumerableProperties(true);

        return true;
    }